

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_block_seek(BigBlock *bb,BigBlockPtr *ptr,ptrdiff_t offset)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  if (bb->size == 0 && offset == 0) {
    ptr->fileid = 0;
    ptr->roffset = 0;
    ptr->aoffset = 0;
    return 0;
  }
  if (offset < 0) {
    offset = offset + bb->foffset[bb->Nfile];
  }
  if (bb->size < (ulong)offset) {
    _big_file_raise("Over the end of file %td of %td",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x2c8);
    iVar3 = -1;
  }
  else {
    iVar5 = bb->Nfile;
    iVar3 = 0;
    psVar1 = bb->foffset;
    iVar4 = 0;
    if (1 < iVar5) {
      iVar4 = 0;
      do {
        iVar6 = (iVar5 - iVar4 >> 1) + iVar4;
        iVar2 = iVar6;
        if (psVar1[iVar6] <= (ulong)offset) {
          iVar2 = iVar5;
          iVar4 = iVar6;
        }
        iVar5 = iVar2;
      } while (iVar4 + 1 < iVar5);
    }
    ptr->fileid = iVar4;
    ptr->roffset = offset - psVar1[iVar4];
    ptr->aoffset = offset;
  }
  return iVar3;
}

Assistant:

int
big_block_seek(BigBlock * bb, BigBlockPtr * ptr, ptrdiff_t offset)
{
    /* handle 0 sized files */
    if(bb->size == 0 && offset == 0) {
        ptr->fileid = 0;
        ptr->roffset = 0;
        ptr->aoffset = 0;
        return 0;
    }
    /* handle negatives */
    if(offset < 0) offset += bb->foffset[bb->Nfile];

    RAISEIF(offset > bb->size, 
            ex_eof,
        /* over the end of file */
        /* note that we allow seeking at the end of file */
            "Over the end of file %td of %td",
            offset, bb->size);
    {
        int left = 0;
        int right = bb->Nfile;
        while(right > left + 1) {
            int mid = ((right - left) >> 1) + left;
            if(bb->foffset[mid] <= offset) {
                left = mid;
            } else {
                right = mid;
            }
        }
        ptr->fileid = left;
        ptr->roffset = offset - bb->foffset[left];
        ptr->aoffset = offset;
        return 0;
    }
ex_eof:
    return -1;
}